

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O3

char * cmGetDefinition(void *arg,char *def)

{
  cmValue cVar1;
  pointer pcVar2;
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,def,&local_31);
  cVar1 = cmMakefile::GetDefinition((cmMakefile *)arg,&local_30);
  if (cVar1.Value == (string *)0x0) {
    pcVar2 = (pointer)0x0;
  }
  else {
    pcVar2 = ((cVar1.Value)->_M_dataplus)._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return pcVar2;
}

Assistant:

static const char* CCONV cmGetDefinition(void* arg, const char* def)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);
  return mf->GetDefinition(def).GetCStr();
}